

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

bool parse_cpu_range(string *range,bool (*boolmask) [512])

{
  long lVar1;
  common_log *log;
  unsigned_long_long uVar2;
  char *fmt;
  bool bVar3;
  unsigned_long_long uVar4;
  size_t i;
  string sStack_48;
  
  lVar1 = std::__cxx11::string::find((char)range,0x2d);
  if (lVar1 == 0) {
    uVar2 = 0;
LAB_001b81db:
    uVar4 = 0x1ff;
    if (lVar1 != range->_M_string_length - 1) {
      std::__cxx11::string::substr((ulong)&sStack_48,(ulong)range);
      uVar4 = std::__cxx11::stoull(&sStack_48,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&sStack_48);
      if (0x1ff < uVar4) {
        if (common_log_verbosity_thold < 0) {
          return false;
        }
        log = common_log_main();
        fmt = "End index out of bounds!\n";
        goto LAB_001b823d;
      }
    }
    for (; uVar2 <= uVar4; uVar2 = uVar2 + 1) {
      (*boolmask)[uVar2] = true;
    }
    bVar3 = true;
  }
  else {
    if (lVar1 == -1) {
      if (common_log_verbosity_thold < 0) {
        return false;
      }
      log = common_log_main();
      fmt = "Format of CPU range is invalid! Expected [<start>]-[<end>].\n";
    }
    else {
      std::__cxx11::string::substr((ulong)&sStack_48,(ulong)range);
      uVar2 = std::__cxx11::stoull(&sStack_48,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)&sStack_48);
      if (uVar2 < 0x200) goto LAB_001b81db;
      if (common_log_verbosity_thold < 0) {
        return false;
      }
      log = common_log_main();
      fmt = "Start index out of bounds!\n";
    }
LAB_001b823d:
    bVar3 = false;
    common_log_add(log,GGML_LOG_LEVEL_ERROR,fmt);
  }
  return bVar3;
}

Assistant:

bool parse_cpu_range(const std::string & range, bool (&boolmask)[GGML_MAX_N_THREADS]) {
    size_t dash_loc = range.find('-');
    if (dash_loc == std::string::npos) {
        LOG_ERR("Format of CPU range is invalid! Expected [<start>]-[<end>].\n");
        return false;
    }

    size_t start_i;
    size_t end_i;

    if (dash_loc == 0) {
        start_i = 0;
    } else {
        start_i = std::stoull(range.substr(0, dash_loc));
        if (start_i >= GGML_MAX_N_THREADS) {
            LOG_ERR("Start index out of bounds!\n");
            return false;
        }
    }

    if (dash_loc == range.length() - 1) {
        end_i = GGML_MAX_N_THREADS - 1;
    } else {
        end_i = std::stoull(range.substr(dash_loc + 1));
        if (end_i >= GGML_MAX_N_THREADS) {
            LOG_ERR("End index out of bounds!\n");
            return false;
        }
    }

    for (size_t i = start_i; i <= end_i; i++) {
        boolmask[i] = true;
    }

    return true;
}